

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2cfb1b::StaleFileRemovalCommand::getShortDescription
          (StaleFileRemovalCommand *this,SmallVectorImpl<char> *result)

{
  allocator local_61;
  string local_60;
  raw_svector_ostream local_40;
  
  llvm::raw_svector_ostream::raw_svector_ostream(&local_40,result);
  if ((this->description)._M_string_length == 0) {
    std::__cxx11::string::string((string *)&local_60,"Stale file removal",&local_61);
  }
  else {
    std::__cxx11::string::string((string *)&local_60,(string *)&this->description);
  }
  llvm::raw_ostream::operator<<((raw_ostream *)&local_40,&local_60);
  std::__cxx11::string::_M_dispose();
  llvm::raw_ostream::~raw_ostream((raw_ostream *)&local_40);
  return;
}

Assistant:

virtual void getShortDescription(SmallVectorImpl<char> &result) const override {
    llvm::raw_svector_ostream(result) << (description.empty() ? "Stale file removal" : description);
  }